

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O2

string * __thiscall
xmrig::HttpContext::ip_abi_cxx11_(string *__return_storage_ptr__,HttpContext *this)

{
  allocator local_cd;
  int size;
  char ip [46];
  sockaddr_storage addr;
  
  ip[0x20] = '\0';
  ip[0x21] = '\0';
  ip[0x22] = '\0';
  ip[0x23] = '\0';
  ip[0x24] = '\0';
  ip[0x25] = '\0';
  ip[0x26] = '\0';
  ip[0x27] = '\0';
  ip[0x28] = '\0';
  ip[0x29] = '\0';
  ip[0x2a] = '\0';
  ip[0x2b] = '\0';
  ip[0x2c] = '\0';
  ip[0x2d] = '\0';
  ip[0x10] = '\0';
  ip[0x11] = '\0';
  ip[0x12] = '\0';
  ip[0x13] = '\0';
  ip[0x14] = '\0';
  ip[0x15] = '\0';
  ip[0x16] = '\0';
  ip[0x17] = '\0';
  ip[0x18] = '\0';
  ip[0x19] = '\0';
  ip[0x1a] = '\0';
  ip[0x1b] = '\0';
  ip[0x1c] = '\0';
  ip[0x1d] = '\0';
  ip[0x1e] = '\0';
  ip[0x1f] = '\0';
  ip[0] = '\0';
  ip[1] = '\0';
  ip[2] = '\0';
  ip[3] = '\0';
  ip[4] = '\0';
  ip[5] = '\0';
  ip[6] = '\0';
  ip[7] = '\0';
  ip[8] = '\0';
  ip[9] = '\0';
  ip[10] = '\0';
  ip[0xb] = '\0';
  ip[0xc] = '\0';
  ip[0xd] = '\0';
  ip[0xe] = '\0';
  ip[0xf] = '\0';
  addr.__ss_padding[0x6e] = '\0';
  addr.__ss_padding[0x6f] = '\0';
  addr.__ss_padding[0x70] = '\0';
  addr.__ss_padding[0x71] = '\0';
  addr.__ss_padding[0x72] = '\0';
  addr.__ss_padding[0x73] = '\0';
  addr.__ss_padding[0x74] = '\0';
  addr.__ss_padding[0x75] = '\0';
  addr.__ss_align = 0;
  addr.__ss_padding[0x5e] = '\0';
  addr.__ss_padding[0x5f] = '\0';
  addr.__ss_padding[0x60] = '\0';
  addr.__ss_padding[0x61] = '\0';
  addr.__ss_padding[0x62] = '\0';
  addr.__ss_padding[99] = '\0';
  addr.__ss_padding[100] = '\0';
  addr.__ss_padding[0x65] = '\0';
  addr.__ss_padding[0x66] = '\0';
  addr.__ss_padding[0x67] = '\0';
  addr.__ss_padding[0x68] = '\0';
  addr.__ss_padding[0x69] = '\0';
  addr.__ss_padding[0x6a] = '\0';
  addr.__ss_padding[0x6b] = '\0';
  addr.__ss_padding[0x6c] = '\0';
  addr.__ss_padding[0x6d] = '\0';
  addr.__ss_padding[0x4e] = '\0';
  addr.__ss_padding[0x4f] = '\0';
  addr.__ss_padding[0x50] = '\0';
  addr.__ss_padding[0x51] = '\0';
  addr.__ss_padding[0x52] = '\0';
  addr.__ss_padding[0x53] = '\0';
  addr.__ss_padding[0x54] = '\0';
  addr.__ss_padding[0x55] = '\0';
  addr.__ss_padding[0x56] = '\0';
  addr.__ss_padding[0x57] = '\0';
  addr.__ss_padding[0x58] = '\0';
  addr.__ss_padding[0x59] = '\0';
  addr.__ss_padding[0x5a] = '\0';
  addr.__ss_padding[0x5b] = '\0';
  addr.__ss_padding[0x5c] = '\0';
  addr.__ss_padding[0x5d] = '\0';
  addr.__ss_padding[0x3e] = '\0';
  addr.__ss_padding[0x3f] = '\0';
  addr.__ss_padding[0x40] = '\0';
  addr.__ss_padding[0x41] = '\0';
  addr.__ss_padding[0x42] = '\0';
  addr.__ss_padding[0x43] = '\0';
  addr.__ss_padding[0x44] = '\0';
  addr.__ss_padding[0x45] = '\0';
  addr.__ss_padding[0x46] = '\0';
  addr.__ss_padding[0x47] = '\0';
  addr.__ss_padding[0x48] = '\0';
  addr.__ss_padding[0x49] = '\0';
  addr.__ss_padding[0x4a] = '\0';
  addr.__ss_padding[0x4b] = '\0';
  addr.__ss_padding[0x4c] = '\0';
  addr.__ss_padding[0x4d] = '\0';
  addr.__ss_padding[0x2e] = '\0';
  addr.__ss_padding[0x2f] = '\0';
  addr.__ss_padding[0x30] = '\0';
  addr.__ss_padding[0x31] = '\0';
  addr.__ss_padding[0x32] = '\0';
  addr.__ss_padding[0x33] = '\0';
  addr.__ss_padding[0x34] = '\0';
  addr.__ss_padding[0x35] = '\0';
  addr.__ss_padding[0x36] = '\0';
  addr.__ss_padding[0x37] = '\0';
  addr.__ss_padding[0x38] = '\0';
  addr.__ss_padding[0x39] = '\0';
  addr.__ss_padding[0x3a] = '\0';
  addr.__ss_padding[0x3b] = '\0';
  addr.__ss_padding[0x3c] = '\0';
  addr.__ss_padding[0x3d] = '\0';
  addr.__ss_padding[0x1e] = '\0';
  addr.__ss_padding[0x1f] = '\0';
  addr.__ss_padding[0x20] = '\0';
  addr.__ss_padding[0x21] = '\0';
  addr.__ss_padding[0x22] = '\0';
  addr.__ss_padding[0x23] = '\0';
  addr.__ss_padding[0x24] = '\0';
  addr.__ss_padding[0x25] = '\0';
  addr.__ss_padding[0x26] = '\0';
  addr.__ss_padding[0x27] = '\0';
  addr.__ss_padding[0x28] = '\0';
  addr.__ss_padding[0x29] = '\0';
  addr.__ss_padding[0x2a] = '\0';
  addr.__ss_padding[0x2b] = '\0';
  addr.__ss_padding[0x2c] = '\0';
  addr.__ss_padding[0x2d] = '\0';
  addr.__ss_padding[0xe] = '\0';
  addr.__ss_padding[0xf] = '\0';
  addr.__ss_padding[0x10] = '\0';
  addr.__ss_padding[0x11] = '\0';
  addr.__ss_padding[0x12] = '\0';
  addr.__ss_padding[0x13] = '\0';
  addr.__ss_padding[0x14] = '\0';
  addr.__ss_padding[0x15] = '\0';
  addr.__ss_padding[0x16] = '\0';
  addr.__ss_padding[0x17] = '\0';
  addr.__ss_padding[0x18] = '\0';
  addr.__ss_padding[0x19] = '\0';
  addr.__ss_padding[0x1a] = '\0';
  addr.__ss_padding[0x1b] = '\0';
  addr.__ss_padding[0x1c] = '\0';
  addr.__ss_padding[0x1d] = '\0';
  addr.ss_family = 0;
  addr.__ss_padding[0] = '\0';
  addr.__ss_padding[1] = '\0';
  addr.__ss_padding[2] = '\0';
  addr.__ss_padding[3] = '\0';
  addr.__ss_padding[4] = '\0';
  addr.__ss_padding[5] = '\0';
  addr.__ss_padding[6] = '\0';
  addr.__ss_padding[7] = '\0';
  addr.__ss_padding[8] = '\0';
  addr.__ss_padding[9] = '\0';
  addr.__ss_padding[10] = '\0';
  addr.__ss_padding[0xb] = '\0';
  addr.__ss_padding[0xc] = '\0';
  addr.__ss_padding[0xd] = '\0';
  size = 0x80;
  uv_tcp_getpeername(this->m_tcp,&addr);
  if (addr.ss_family == 10) {
    uv_ip6_name(&addr,ip,0x2d);
  }
  else {
    uv_ip4_name(&addr,ip,0x10);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,ip,&local_cd);
  return __return_storage_ptr__;
}

Assistant:

std::string xmrig::HttpContext::ip() const
{
    char ip[46]           = {};
    sockaddr_storage addr = {};
    int size              = sizeof(addr);

    uv_tcp_getpeername(m_tcp, reinterpret_cast<sockaddr*>(&addr), &size);
    if (reinterpret_cast<sockaddr_in *>(&addr)->sin_family == AF_INET6) {
        uv_ip6_name(reinterpret_cast<sockaddr_in6*>(&addr), ip, 45);
    }
    else {
        uv_ip4_name(reinterpret_cast<sockaddr_in*>(&addr), ip, 16);
    }

    return ip;
}